

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_glyph_interpolate_strong_points(PSH_Glyph glyph,FT_Int dimension)

{
  int iVar1;
  PSH_Hint_conflict pPVar2;
  long lVar3;
  uint uVar4;
  FT_Long FVar5;
  FT_UInt FVar6;
  long lVar7;
  FT_Pos *pFVar8;
  long lVar9;
  
  FVar6 = glyph->num_points;
  if (FVar6 != 0) {
    lVar9 = (long)(int)glyph->globals->dimension[(uint)dimension].scale_mult;
    pFVar8 = &glyph->points->cur_u;
    do {
      pPVar2 = (PSH_Hint_conflict)pFVar8[-3];
      if (pPVar2 != (PSH_Hint_conflict)0x0) {
        uVar4 = *(FT_UInt *)((long)pFVar8 + -0x24);
        if ((uVar4 >> 9 & 1) == 0) {
          if ((uVar4 >> 10 & 1) == 0) {
            lVar7 = pFVar8[-2] - (long)pPVar2->org_pos;
            if (lVar7 != 0 && (long)pPVar2->org_pos <= pFVar8[-2]) {
              iVar1 = pPVar2->org_len;
              lVar3 = pPVar2->cur_pos;
              if (lVar7 < iVar1) {
                FVar5 = FT_MulDiv(lVar7,pPVar2->cur_len,(long)iVar1);
                *pFVar8 = FVar5 + lVar3;
                uVar4 = *(FT_UInt *)((long)pFVar8 + -0x24);
              }
              else {
                lVar7 = ((int)lVar7 - iVar1) * lVar9;
                *pFVar8 = lVar3 + pPVar2->cur_len +
                          (long)(int)((ulong)(lVar7 + (lVar7 >> 0x3f) + 0x8000) >> 0x10);
              }
              goto LAB_00237a5f;
            }
            lVar7 = (int)lVar7 * lVar9;
            lVar7 = (long)(int)((ulong)(lVar7 + (lVar7 >> 0x3f) + 0x8000) >> 0x10);
          }
          else {
            lVar7 = pPVar2->cur_len;
          }
          *pFVar8 = lVar7 + pPVar2->cur_pos;
        }
        else {
          *pFVar8 = pPVar2->cur_pos;
        }
LAB_00237a5f:
        *(uint *)((long)pFVar8 + -0x24) = uVar4 | 0x20;
      }
      pFVar8 = pFVar8 + 9;
      FVar6 = FVar6 - 1;
    } while (FVar6 != 0);
  }
  return;
}

Assistant:

static void
  psh_glyph_interpolate_strong_points( PSH_Glyph  glyph,
                                       FT_Int     dimension )
  {
    PSH_Dimension  dim   = &glyph->globals->dimension[dimension];
    FT_Fixed       scale = dim->scale_mult;

    FT_UInt        count = glyph->num_points;
    PSH_Point      point = glyph->points;


    for ( ; count > 0; count--, point++ )
    {
      PSH_Hint  hint = point->hint;


      if ( hint )
      {
        FT_Pos  delta;


        if ( psh_point_is_edge_min( point ) )
          point->cur_u = hint->cur_pos;

        else if ( psh_point_is_edge_max( point ) )
          point->cur_u = hint->cur_pos + hint->cur_len;

        else
        {
          delta = point->org_u - hint->org_pos;

          if ( delta <= 0 )
            point->cur_u = hint->cur_pos + FT_MulFix( delta, scale );

          else if ( delta >= hint->org_len )
            point->cur_u = hint->cur_pos + hint->cur_len +
                             FT_MulFix( delta - hint->org_len, scale );

          else /* hint->org_len > 0 */
            point->cur_u = hint->cur_pos +
                             FT_MulDiv( delta, hint->cur_len,
                                        hint->org_len );
        }
        psh_point_set_fitted( point );
      }
    }
  }